

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_adaptive_eval_grid.h
# Opt level: O1

void __thiscall
embree::sse2::FeatureAdaptiveEvalGrid::FeatureAdaptiveEvalGrid
          (FeatureAdaptiveEvalGrid *this,GeneralCatmullClarkPatch3fa *patch,uint subPatch,uint x0,
          uint x1,uint y0,uint y1,uint swidth,uint sheight,float *Px,float *Py,float *Pz,float *U,
          float *V,float *Nx,float *Ny,float *Nz,uint dwidth,uint dheight)

{
  GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *pGVar1;
  Vec3fa *ptr;
  float *pfVar2;
  long lVar3;
  DynamicStackArray<float,_16UL,_64UL> *pDVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  BBox2f srange1;
  array_t<embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>,_16UL> patches;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_d0f8;
  float local_d0f0;
  float fStack_d0ec;
  uint local_d0e4;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_d0e0;
  float fStack_d0d8;
  float fStack_d0d4;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_d0d0;
  float fStack_d0c8;
  float fStack_d0c4;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_d0c0;
  uint uStack_d0b8;
  uint uStack_d0b4;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_d0b0;
  undefined8 uStack_d0a8;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_d0a0;
  float fStack_d098;
  float fStack_d094;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_d090;
  undefined8 uStack_d088;
  array_t<embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>,_16UL> local_d080;
  
  this->x0 = x0;
  this->x1 = x1;
  this->y0 = y0;
  this->y1 = y1;
  this->swidth = swidth;
  this->sheight = sheight;
  auVar5._4_4_ = 0;
  auVar5._0_4_ = swidth;
  auVar5._8_4_ = sheight;
  auVar5._12_4_ = 0;
  auVar6._4_4_ = (float)(SUB168(auVar5 | _DAT_01ff7230,8) - DAT_01ff7230._8_8_) + -1.0;
  auVar6._0_4_ = (float)(SUB168(auVar5 | _DAT_01ff7230,0) - (double)DAT_01ff7230) + -1.0;
  auVar6._8_8_ = 0;
  auVar6 = divps(_DAT_01feca30,auVar6);
  this->rcp_swidth = (float)(int)auVar6._0_8_;
  this->rcp_sheight = (float)(int)((ulong)auVar6._0_8_ >> 0x20);
  this->Px = Px;
  this->Py = Py;
  this->Pz = Pz;
  this->U = U;
  this->V = V;
  this->Nx = Nx;
  this->Ny = Ny;
  this->Nz = Nz;
  this->dwidth = dwidth;
  local_d0f0 = (float)(swidth - 1);
  fStack_d0ec = (float)(sheight - 1);
  this->count = 0;
  local_d0f8 = (anon_union_8_2_4062524c_for_Vec2<float>_1)0x0;
  local_d0e0.field_0.x =
       ((float)(x0 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(x0 & 0xffff | 0x4b000000);
  local_d0e0.field_0.y =
       ((float)(y0 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(y0 & 0xffff | 0x4b000000);
  fStack_d0d8 = ((float)(x1 >> 0x10 | 0x53000000) - 5.497642e+11) +
                (float)(x1 & 0xffff | 0x4b000000);
  fStack_d0d4 = ((float)(y1 >> 0x10 | 0x53000000) - 5.497642e+11) +
                (float)(y1 & 0xffff | 0x4b000000);
  if ((((patch->N == 4) && (pGVar1 = (patch->ring).data, pGVar1->only_quads == true)) &&
      (pGVar1[1].only_quads == true)) &&
     ((pGVar1[2].only_quads == true && (pGVar1[3].only_quads == true)))) {
    lVar3 = 0;
    do {
      *(long *)((long)local_d080.items[0].ring.items[0].crease_weight.arr + lVar3 + 0x40U) =
           (long)local_d080.items[0].ring.items[0].crease_weight.arr + lVar3;
      *(undefined8 *)
       ((long)local_d080.items[0].ring.items[0].ring.arr + lVar3 + 0xffffffffffffffc8U) = 0;
      *(long *)((long)&local_d080.items[0].ring.items[0].ring.data + lVar3) =
           (long)local_d080.items[0].ring.items[0].ring.arr + lVar3;
      lVar3 = lVar3 + 0x340;
    } while (lVar3 != 0xd00);
    GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>::init
              (patch,(EVP_PKEY_CTX *)&local_d080);
    eval(this,local_d080.items,(BBox2f *)&local_d0f8.field_0,(BBox2f *)&local_d0e0.field_0,0,
         (BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0);
    lVar3 = -0xd00;
    pDVar4 = &local_d080.items[0].ring.items[3].crease_weight;
    do {
      ptr = *(Vec3fa **)((Vec3fa *)(pDVar4 + 5) + 4);
      if (ptr != (Vec3fa *)0x0 &&
          (DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)((long)(pDVar4 + 1) + 0x40) !=
          (DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)ptr) {
        alignedFree(ptr);
      }
      pfVar2 = pDVar4->data;
      if (pfVar2 != (float *)0x0 && pDVar4 != (DynamicStackArray<float,_16UL,_64UL> *)pfVar2) {
        operator_delete__(pfVar2);
      }
      pDVar4 = (DynamicStackArray<float,_16UL,_64UL> *)((long)(pDVar4 + -7) + 0x40);
      lVar3 = lVar3 + 0x340;
    } while (lVar3 != 0);
  }
  else {
    sse2::FeatureAdaptiveEvalGrid();
    GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>::subdivide
              (patch,&local_d080,&local_d0e4);
    if (local_d0e4 == 4) {
      uStack_d0a8 = CONCAT44(fStack_d0ec,local_d0f0);
      local_d0d0.field_0.x = local_d0f8.field_0.x;
      local_d0a0.field_0.y = local_d0f8.field_0.y;
      local_d0b0.field_0.x = (local_d0d0.field_0.x + local_d0f0) * 0.5;
      local_d0b0.field_0.y = (local_d0a0.field_0.y + fStack_d0ec) * 0.5;
      local_d090.field_0 = local_d0f8.field_0;
      fStack_d098 = local_d0f0;
      fStack_d0c4 = fStack_d0ec;
      local_d0d0.field_0.y = local_d0b0.field_0.y;
      fStack_d0c8 = local_d0b0.field_0.x;
      local_d0a0.field_0.x = local_d0b0.field_0.x;
      fStack_d094 = local_d0b0.field_0.y;
      uStack_d088 = local_d0b0;
      GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>::fix_quad_ring_order(&local_d080);
      local_d0c0.field_0.x =
           (float)(~-(uint)(local_d090.field_0.x < local_d0e0.field_0.x) &
                   (uint)local_d090.field_0.x |
                  (uint)local_d0e0.field_0.x & -(uint)(local_d090.field_0.x < local_d0e0.field_0.x))
      ;
      local_d0c0.field_0.y =
           (float)(~-(uint)(local_d090.field_0.y < local_d0e0.field_0.y) &
                   (uint)local_d090.field_0.y |
                  (uint)local_d0e0.field_0.y & -(uint)(local_d090.field_0.y < local_d0e0.field_0.y))
      ;
      uStack_d0b8 = ~-(uint)((float)uStack_d088 < fStack_d0d8) & (uint)fStack_d0d8 |
                    (uint)(float)uStack_d088 & -(uint)((float)uStack_d088 < fStack_d0d8);
      uStack_d0b4 = ~-(uint)(uStack_d088._4_4_ < fStack_d0d4) & (uint)fStack_d0d4 |
                    (uint)uStack_d088._4_4_ & -(uint)(uStack_d088._4_4_ < fStack_d0d4);
      eval(this,local_d080.items,(BBox2f *)&local_d090.field_0,(BBox2f *)&local_d0c0.field_0,1,
           (BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0);
      local_d0c0.field_0.x =
           (float)(~-(uint)(local_d0a0.field_0.x < local_d0e0.field_0.x) &
                   (uint)local_d0a0.field_0.x |
                  (uint)local_d0e0.field_0.x & -(uint)(local_d0a0.field_0.x < local_d0e0.field_0.x))
      ;
      local_d0c0.field_0.y =
           (float)(~-(uint)(local_d0a0.field_0.y < local_d0e0.field_0.y) &
                   (uint)local_d0a0.field_0.y |
                  (uint)local_d0e0.field_0.y & -(uint)(local_d0a0.field_0.y < local_d0e0.field_0.y))
      ;
      uStack_d0b8 = ~-(uint)(fStack_d098 < fStack_d0d8) & (uint)fStack_d0d8 |
                    (uint)fStack_d098 & -(uint)(fStack_d098 < fStack_d0d8);
      uStack_d0b4 = ~-(uint)(fStack_d094 < fStack_d0d4) & (uint)fStack_d0d4 |
                    (uint)fStack_d094 & -(uint)(fStack_d094 < fStack_d0d4);
      eval(this,local_d080.items + 1,(BBox2f *)&local_d0a0.field_0,(BBox2f *)&local_d0c0.field_0,1,
           (BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0);
      local_d0c0.field_0.x =
           (float)(~-(uint)(local_d0b0.field_0.x < local_d0e0.field_0.x) &
                   (uint)local_d0b0.field_0.x |
                  (uint)local_d0e0.field_0.x & -(uint)(local_d0b0.field_0.x < local_d0e0.field_0.x))
      ;
      local_d0c0.field_0.y =
           (float)(~-(uint)(local_d0b0.field_0.y < local_d0e0.field_0.y) &
                   (uint)local_d0b0.field_0.y |
                  (uint)local_d0e0.field_0.y & -(uint)(local_d0b0.field_0.y < local_d0e0.field_0.y))
      ;
      uStack_d0b8 = ~-(uint)((float)uStack_d0a8 < fStack_d0d8) & (uint)fStack_d0d8 |
                    (uint)(float)uStack_d0a8 & -(uint)((float)uStack_d0a8 < fStack_d0d8);
      uStack_d0b4 = ~-(uint)(uStack_d0a8._4_4_ < fStack_d0d4) & (uint)fStack_d0d4 |
                    (uint)uStack_d0a8._4_4_ & -(uint)(uStack_d0a8._4_4_ < fStack_d0d4);
      eval(this,local_d080.items + 2,(BBox2f *)&local_d0b0.field_0,(BBox2f *)&local_d0c0.field_0,1,
           (BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0);
      local_d0c0.field_0.x =
           (float)(~-(uint)(local_d0d0.field_0.x < local_d0e0.field_0.x) &
                   (uint)local_d0d0.field_0.x |
                  (uint)local_d0e0.field_0.x & -(uint)(local_d0d0.field_0.x < local_d0e0.field_0.x))
      ;
      local_d0c0.field_0.y =
           (float)(~-(uint)(local_d0d0.field_0.y < local_d0e0.field_0.y) &
                   (uint)local_d0d0.field_0.y |
                  (uint)local_d0e0.field_0.y & -(uint)(local_d0d0.field_0.y < local_d0e0.field_0.y))
      ;
      uStack_d0b8 = ~-(uint)(fStack_d0c8 < fStack_d0d8) & (uint)fStack_d0d8 |
                    (uint)fStack_d0c8 & -(uint)(fStack_d0c8 < fStack_d0d8);
      uStack_d0b4 = ~-(uint)(fStack_d0c4 < fStack_d0d4) & (uint)fStack_d0d4 |
                    (uint)fStack_d0c4 & -(uint)(fStack_d0c4 < fStack_d0d4);
      eval(this,local_d080.items + 3,(BBox2f *)&local_d0d0.field_0,(BBox2f *)&local_d0c0.field_0,1,
           (BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0);
    }
    else {
      eval(this,local_d080.items + subPatch,(BBox2f *)&local_d0f8.field_0,
           (BBox2f *)&local_d0e0.field_0,1,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,
           (BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0);
    }
    array_t<embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>,_16UL>::~array_t(&local_d080)
    ;
  }
  return;
}

Assistant:

FeatureAdaptiveEvalGrid (const GeneralCatmullClarkPatch3fa& patch, unsigned subPatch,
                               const unsigned x0, const unsigned x1, const unsigned y0, const unsigned y1, const unsigned swidth, const unsigned sheight, 
                               float* Px, float* Py, float* Pz, float* U, float* V, 
                               float* Nx, float* Ny, float* Nz,
                               const unsigned dwidth, const unsigned dheight)
      : x0(x0), x1(x1), y0(y0), y1(y1), swidth(swidth), sheight(sheight), rcp_swidth(1.0f/(swidth-1.0f)), rcp_sheight(1.0f/(sheight-1.0f)), 
        Px(Px), Py(Py), Pz(Pz), U(U), V(V), Nx(Nx), Ny(Ny), Nz(Nz), dwidth(dwidth), /*dheight(dheight),*/ count(0)
      {
        assert(swidth < (2<<20) && sheight < (2<<20));
        const BBox2f srange(Vec2f(0.0f,0.0f),Vec2f(float(swidth-1),float(sheight-1)));
        const BBox2f erange(Vec2f((float)x0,(float)y0),Vec2f((float)x1,(float)y1));
        
        /* convert into standard quad patch if possible */
        if (likely(patch.isQuadPatch())) 
        {
          CatmullClarkPatch3fa qpatch; patch.init(qpatch);
          eval(qpatch, srange, erange, 0);
          assert(count == (x1-x0+1)*(y1-y0+1));
          return;
        }
        
        /* subdivide patch */
        unsigned N;
        array_t<CatmullClarkPatch3fa,GeneralCatmullClarkPatch3fa::SIZE> patches; 
        patch.subdivide(patches,N);
        
        if (N == 4)
        {
          const Vec2f c = srange.center();
          const BBox2f srange0(srange.lower,c);
          const BBox2f srange1(Vec2f(c.x,srange.lower.y),Vec2f(srange.upper.x,c.y));
          const BBox2f srange2(c,srange.upper);
          const BBox2f srange3(Vec2f(srange.lower.x,c.y),Vec2f(c.x,srange.upper.y));

#if PATCH_USE_GREGORY == 2
          BezierCurve3fa borders[GeneralCatmullClarkPatch3fa::SIZE]; patch.getLimitBorder(borders);
          BezierCurve3fa border0l,border0r; borders[0].subdivide(border0l,border0r);
          BezierCurve3fa border1l,border1r; borders[1].subdivide(border1l,border1r);
          BezierCurve3fa border2l,border2r; borders[2].subdivide(border2l,border2r);
          BezierCurve3fa border3l,border3r; borders[3].subdivide(border3l,border3r);
          GeneralCatmullClarkPatch3fa::fix_quad_ring_order(patches);
          eval(patches[0],srange0,intersect(srange0,erange),1,&border0l,nullptr,nullptr,&border3r);
          eval(patches[1],srange1,intersect(srange1,erange),1,&border0r,&border1l,nullptr,nullptr);
          eval(patches[2],srange2,intersect(srange2,erange),1,nullptr,&border1r,&border2l,nullptr);
          eval(patches[3],srange3,intersect(srange3,erange),1,nullptr,nullptr,&border2r,&border3l);
#else
          GeneralCatmullClarkPatch3fa::fix_quad_ring_order(patches);
          eval(patches[0],srange0,intersect(srange0,erange),1);
          eval(patches[1],srange1,intersect(srange1,erange),1);
          eval(patches[2],srange2,intersect(srange2,erange),1);
          eval(patches[3],srange3,intersect(srange3,erange),1);
#endif
        }
        else
        {
          assert(subPatch < N);
          
#if PATCH_USE_GREGORY == 2
          BezierCurve3fa borders[2]; patch.getLimitBorder(borders,subPatch);
          BezierCurve3fa border0l,border0r; borders[0].subdivide(border0l,border0r);
          BezierCurve3fa border2l,border2r; borders[1].subdivide(border2l,border2r);
          eval(patches[subPatch], srange, erange, 1, &border0l, nullptr, nullptr, &border2r);
#else
          eval(patches[subPatch], srange, erange, 1);
#endif
          
        }
        assert(count == (x1-x0+1)*(y1-y0+1));
      }